

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas2.c
# Opt level: O0

int sp_ztrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,doublecomplex *x,
            SuperLUStat_t *stat,int *info)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  doublecomplex *Mxvec;
  double ci_6;
  double cr_6;
  double ci_5;
  double cr_5;
  double ci_4;
  double cr_4;
  double ci_3;
  double cr_3;
  double ci_2;
  double cr_2;
  double ci_1;
  double cr_1;
  double ci;
  double cr;
  char msg [256];
  int ii;
  flops_t solve_ops;
  doublecomplex *work;
  int local_d0;
  int_t iptr;
  int_t k;
  int_t i;
  int_t istart;
  int_t luptr;
  int nsupc;
  int nsupr;
  int fsupc;
  int jcol;
  int irow;
  int nrow;
  doublecomplex comp_zero;
  doublecomplex beta;
  doublecomplex alpha;
  doublecomplex temp;
  int incy;
  int incx;
  doublecomplex *Uval;
  doublecomplex *Lval;
  NCformat *Ustore;
  SCformat *Lstore;
  doublecomplex *x_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  char *diag_local;
  char *trans_local;
  char *uplo_local;
  
  temp.i._4_4_ = 1;
  temp.i._0_4_ = 1;
  alpha.r = 0.0;
  comp_zero.i = 1.0;
  memset(&irow,0,0x10);
  *info = 0;
  iVar6 = strncmp(uplo,"L",1);
  if ((iVar6 == 0) || (iVar6 = strncmp(uplo,"U",1), iVar6 == 0)) {
    iVar6 = strncmp(trans,"N",1);
    if ((iVar6 == 0) ||
       ((iVar6 = strncmp(trans,"T",1), iVar6 == 0 || (iVar6 = strncmp(trans,"C",1), iVar6 == 0)))) {
      iVar6 = strncmp(diag,"U",1);
      if ((iVar6 == 0) || (iVar6 = strncmp(diag,"N",1), iVar6 == 0)) {
        if ((L->nrow == L->ncol) && (-1 < L->nrow)) {
          if ((U->nrow != U->ncol) || (U->nrow < 0)) {
            *info = -5;
          }
        }
        else {
          *info = -4;
        }
      }
      else {
        *info = -3;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    pvVar2 = L->Store;
    lVar3 = *(long *)((long)pvVar2 + 8);
    pvVar4 = U->Store;
    lVar5 = *(long *)((long)pvVar4 + 8);
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    Mxvec = doublecomplexCalloc((long)L->nrow);
    if (Mxvec == (doublecomplex *)0x0) {
      sprintf((char *)&cr,"%s at line %d in file %s\n","Malloc fails for work in sp_ztrsv().",0x81,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c"
             );
      superlu_abort_and_exit((char *)&cr);
    }
    iVar6 = strncmp(trans,"N",1);
    if (iVar6 == 0) {
      iVar6 = strncmp(uplo,"L",1);
      if (iVar6 == 0) {
        if (L->nrow == 0) {
          return 0;
        }
        for (local_d0 = 0; local_d0 <= *(int *)((long)pvVar2 + 4); local_d0 = local_d0 + 1) {
          nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_d0 * 4);
          work._4_4_ = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
          luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) - work._4_4_;
          istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4) - nsupc;
          i = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
          jcol = luptr - istart;
          msg._252_4_ = (float)(jcol * 8 * istart) +
                        (float)(istart * 4 * (istart + -1) + istart * 10) + (float)msg._252_4_;
          if (istart == 1) {
            while (work._4_4_ = work._4_4_ + 1,
                  work._4_4_ < *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4)) {
              fsupc = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)work._4_4_ * 4);
              i = i + 1;
              _irow = x[nsupc].r * *(double *)(lVar3 + (long)i * 0x10) +
                      -(x[nsupc].i * *(double *)(lVar3 + (long)i * 0x10 + 8));
              comp_zero.r = x[nsupc].i * *(double *)(lVar3 + (long)i * 0x10) +
                            x[nsupc].r * *(double *)(lVar3 + (long)i * 0x10 + 8);
              x[fsupc].r = x[fsupc].r - _irow;
              x[fsupc].i = x[fsupc].i - comp_zero.r;
            }
          }
          else {
            zlsolve(luptr,istart,(doublecomplex *)(lVar3 + (long)i * 0x10),x + nsupc);
            zmatvec(luptr,luptr - istart,istart,(doublecomplex *)(lVar3 + (long)(i + istart) * 0x10)
                    ,x + nsupc,Mxvec);
            work._4_4_ = work._4_4_ + istart;
            for (iptr = 0; iptr < jcol; iptr = iptr + 1) {
              fsupc = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)work._4_4_ * 4);
              x[fsupc].r = x[fsupc].r - Mxvec[iptr].r;
              x[fsupc].i = x[fsupc].i - Mxvec[iptr].i;
              Mxvec[iptr].r = _irow;
              Mxvec[iptr].i = comp_zero.r;
              work._4_4_ = work._4_4_ + 1;
            }
          }
        }
      }
      else {
        if (U->nrow == 0) {
          return 0;
        }
        for (local_d0 = *(int *)((long)pvVar2 + 4); -1 < local_d0; local_d0 = local_d0 + -1) {
          nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_d0 * 4);
          luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) -
                  *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
          istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4) - nsupc;
          iVar6 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
          msg._252_4_ = (float)(istart * 4 * (istart + 1) + istart * 10) + (float)msg._252_4_;
          if (istart == 1) {
            z_div(x + nsupc,x + nsupc,(doublecomplex *)(lVar3 + (long)iVar6 * 0x10));
            for (iptr = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupc * 4);
                iptr < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupc + 1) * 4);
                iptr = iptr + 1) {
              fsupc = *(int *)(*(long *)((long)pvVar4 + 0x10) + (long)iptr * 4);
              _irow = x[nsupc].r * *(double *)(lVar5 + (long)iptr * 0x10) +
                      -(x[nsupc].i * *(double *)(lVar5 + (long)iptr * 0x10 + 8));
              comp_zero.r = x[nsupc].i * *(double *)(lVar5 + (long)iptr * 0x10) +
                            x[nsupc].r * *(double *)(lVar5 + (long)iptr * 0x10 + 8);
              x[fsupc].r = x[fsupc].r - _irow;
              x[fsupc].i = x[fsupc].i - comp_zero.r;
            }
          }
          else {
            zusolve(luptr,istart,(doublecomplex *)(lVar3 + (long)iVar6 * 0x10),x + nsupc);
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4);
                nsupr = nsupr + 1) {
              msg._252_4_ = (float)((*(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4
                                             ) -
                                    *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4)) * 8)
                            + (float)msg._252_4_;
              for (iptr = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4);
                  iptr < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar4 + 0x10) + (long)iptr * 4);
                _irow = x[nsupr].r * *(double *)(lVar5 + (long)iptr * 0x10) +
                        -(x[nsupr].i * *(double *)(lVar5 + (long)iptr * 0x10 + 8));
                comp_zero.r = x[nsupr].i * *(double *)(lVar5 + (long)iptr * 0x10) +
                              x[nsupr].r * *(double *)(lVar5 + (long)iptr * 0x10 + 8);
                x[fsupc].r = x[fsupc].r - _irow;
                x[fsupc].i = x[fsupc].i - comp_zero.r;
              }
            }
          }
        }
      }
    }
    else {
      iVar6 = strncmp(trans,"T",1);
      if (iVar6 == 0) {
        iVar6 = strncmp(uplo,"L",1);
        if (iVar6 == 0) {
          if (L->nrow == 0) {
            return 0;
          }
          for (local_d0 = *(int *)((long)pvVar2 + 4); -1 < local_d0; local_d0 = local_d0 + -1) {
            nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_d0 * 4);
            iVar6 = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
            luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) - iVar6;
            istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4) - nsupc;
            iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
            msg._252_4_ = (float)((luptr - istart) * 8 * istart) + (float)msg._252_4_;
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4);
                nsupr = nsupr + 1) {
              work._4_4_ = iVar6 + istart;
              for (iptr = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupr * 4) + istart;
                  iptr < *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)work._4_4_ * 4);
                _irow = x[fsupc].r * *(double *)(lVar3 + (long)iptr * 0x10) +
                        -(x[fsupc].i * *(double *)(lVar3 + (long)iptr * 0x10 + 8));
                comp_zero.r = x[fsupc].i * *(double *)(lVar3 + (long)iptr * 0x10) +
                              x[fsupc].r * *(double *)(lVar3 + (long)iptr * 0x10 + 8);
                x[nsupr].r = x[nsupr].r - _irow;
                x[nsupr].i = x[nsupr].i - comp_zero.r;
                work._4_4_ = work._4_4_ + 1;
              }
            }
            if (1 < istart) {
              msg._252_4_ = (float)(istart * 4 * (istart + -1)) + (float)msg._252_4_;
              ztrsv_("L","T","U",&istart,(doublecomplex *)(lVar3 + (long)iVar1 * 0x10),&luptr,
                     x + nsupc,(integer *)((long)&temp.i + 4));
            }
          }
        }
        else {
          if (U->nrow == 0) {
            return 0;
          }
          for (local_d0 = 0; local_d0 <= *(int *)((long)pvVar2 + 4); local_d0 = local_d0 + 1) {
            nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_d0 * 4);
            luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) -
                    *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
            istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4) - nsupc;
            iVar6 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4);
                nsupr = nsupr + 1) {
              msg._252_4_ = (float)((*(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4
                                             ) -
                                    *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4)) * 8)
                            + (float)msg._252_4_;
              for (iptr = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4);
                  iptr < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar4 + 0x10) + (long)iptr * 4);
                _irow = x[fsupc].r * *(double *)(lVar5 + (long)iptr * 0x10) +
                        -(x[fsupc].i * *(double *)(lVar5 + (long)iptr * 0x10 + 8));
                comp_zero.r = x[fsupc].i * *(double *)(lVar5 + (long)iptr * 0x10) +
                              x[fsupc].r * *(double *)(lVar5 + (long)iptr * 0x10 + 8);
                x[nsupr].r = x[nsupr].r - _irow;
                x[nsupr].i = x[nsupr].i - comp_zero.r;
              }
            }
            msg._252_4_ = (float)(istart * 4 * (istart + 1) + istart * 10) + (float)msg._252_4_;
            if (istart == 1) {
              z_div(x + nsupc,x + nsupc,(doublecomplex *)(lVar3 + (long)iVar6 * 0x10));
            }
            else {
              ztrsv_("U","T","N",&istart,(doublecomplex *)(lVar3 + (long)iVar6 * 0x10),&luptr,
                     x + nsupc,(integer *)((long)&temp.i + 4));
            }
          }
        }
      }
      else {
        iVar6 = strncmp(uplo,"L",1);
        if (iVar6 == 0) {
          if (L->nrow == 0) {
            return 0;
          }
          for (local_d0 = *(int *)((long)pvVar2 + 4); -1 < local_d0; local_d0 = local_d0 + -1) {
            nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_d0 * 4);
            iVar6 = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
            luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) - iVar6;
            istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4) - nsupc;
            iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
            msg._252_4_ = (float)((luptr - istart) * 8 * istart) + (float)msg._252_4_;
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4);
                nsupr = nsupr + 1) {
              work._4_4_ = iVar6 + istart;
              for (iptr = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupr * 4) + istart;
                  iptr < *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)work._4_4_ * 4);
                alpha.i = *(double *)(lVar3 + (long)iptr * 0x10);
                temp.r = -*(double *)(lVar3 + (long)iptr * 0x10 + 8);
                _irow = x[fsupc].r * alpha.i + -(x[fsupc].i * temp.r);
                comp_zero.r = x[fsupc].i * alpha.i + x[fsupc].r * temp.r;
                x[nsupr].r = x[nsupr].r - _irow;
                x[nsupr].i = x[nsupr].i - comp_zero.r;
                work._4_4_ = work._4_4_ + 1;
              }
            }
            if (1 < istart) {
              msg._252_4_ = (float)(istart * 4 * (istart + -1)) + (float)msg._252_4_;
              ztrsv_("L",trans,"U",&istart,(doublecomplex *)(lVar3 + (long)iVar1 * 0x10),&luptr,
                     x + nsupc,(integer *)((long)&temp.i + 4));
            }
          }
        }
        else {
          if (U->nrow == 0) {
            return 0;
          }
          for (local_d0 = 0; local_d0 <= *(int *)((long)pvVar2 + 4); local_d0 = local_d0 + 1) {
            nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_d0 * 4);
            luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) -
                    *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
            istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4) - nsupc;
            iVar6 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_d0 + 1) * 4);
                nsupr = nsupr + 1) {
              msg._252_4_ = (float)((*(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4
                                             ) -
                                    *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4)) * 8)
                            + (float)msg._252_4_;
              for (iptr = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4);
                  iptr < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar4 + 0x10) + (long)iptr * 4);
                alpha.i = *(double *)(lVar5 + (long)iptr * 0x10);
                temp.r = -*(double *)(lVar5 + (long)iptr * 0x10 + 8);
                _irow = x[fsupc].r * alpha.i + -(x[fsupc].i * temp.r);
                comp_zero.r = x[fsupc].i * alpha.i + x[fsupc].r * temp.r;
                x[nsupr].r = x[nsupr].r - _irow;
                x[nsupr].i = x[nsupr].i - comp_zero.r;
              }
            }
            msg._252_4_ = (float)(istart * 4 * (istart + 1) + istart * 10) + (float)msg._252_4_;
            if (istart == 1) {
              alpha.i = *(double *)(lVar3 + (long)iVar6 * 0x10);
              temp.r = -*(double *)(lVar3 + (long)iVar6 * 0x10 + 8);
              z_div(x + nsupc,x + nsupc,(doublecomplex *)&alpha.i);
            }
            else {
              ztrsv_("U",trans,"N",&istart,(doublecomplex *)(lVar3 + (long)iVar6 * 0x10),&luptr,
                     x + nsupc,(integer *)((long)&temp.i + 4));
            }
          }
        }
      }
    }
    stat->ops[0x11] = (float)msg._252_4_ + stat->ops[0x11];
    superlu_free(Mxvec);
    return 0;
  }
  msg._248_4_ = -*info;
  input_error("sp_ztrsv",(int *)(msg + 0xf8));
  return 0;
}

Assistant:

int
sp_ztrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, doublecomplex *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex   *Lval, *Uval;
    int incx = 1, incy = 1;
    doublecomplex temp;
    doublecomplex alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    doublecomplex comp_zero = {0.0, 0.0};
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    doublecomplex *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_ztrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = doublecomplexCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_ztrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

                /* 1 z_div costs 10 flops */
	        solve_ops += 4 * nsupc * (nsupc - 1) + 10 * nsupc;
	        solve_ops += 8 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			zz_mult(&comp_zero, &x[fsupc], &Lval[luptr]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    CGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    ztrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    zgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    zlsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    zmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			z_sub(&x[irow], &x[irow], &work[i]); /* Scatter */
			work[i] = comp_zero;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
                /* 1 z_div costs 10 flops */
    	        solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    z_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			zz_mult(&comp_zero, &x[fsupc], &Uval[i]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    ztrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    zusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			zz_mult(&comp_zero, &x[jcol], &Uval[i]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else if ( strncmp(trans, "T", 1)==0 ) { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			zz_mult(&comp_zero, &x[irow], &Lval[i]);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    ztrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			zz_mult(&comp_zero, &x[irow], &Uval[i]);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 z_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    z_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    ztrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    } else { /* Form x := conj(inv(A'))*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := conj(inv(L'))*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
                        zz_conj(&temp, &Lval[i]);
			zz_mult(&comp_zero, &x[irow], &temp);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
 		}
 		
 		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    ZTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
                    ztrsv_("L", trans, "U", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := conj(inv(U'))*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
                        zz_conj(&temp, &Uval[i]);
			zz_mult(&comp_zero, &x[irow], &temp);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 z_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;
 
		if ( nsupc == 1 ) {
                    zz_conj(&temp, &Lval[luptr]);
		    z_div(&x[fsupc], &x[fsupc], &temp);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    ZTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
                    ztrsv_("U", trans, "N", &nsupc, &Lval[luptr], &nsupr,
                               &x[fsupc], &incx);
#endif
  		}
  	    } /* for k ... */
  	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}